

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator*=(TPZSkylMatrix<double> *this,double value)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  double **ppdVar4;
  TPZSkylMatrix<double> *in_RDI;
  double in_XMM0_Qa;
  double *end;
  double *elem;
  int64_t colmax;
  int64_t col;
  double *local_30;
  int64_t local_20;
  
  bVar2 = IsZero(in_XMM0_Qa);
  if (bVar2) {
    (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
  }
  else {
    iVar3 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])();
    for (local_20 = 0; local_20 < CONCAT44(extraout_var,iVar3); local_20 = local_20 + 1) {
      ppdVar4 = TPZVec<double_*>::operator[](&in_RDI->fElem,local_20);
      local_30 = *ppdVar4;
      ppdVar4 = TPZVec<double_*>::operator[](&in_RDI->fElem,local_20 + 1);
      pdVar1 = *ppdVar4;
      while (local_30 < pdVar1) {
        *local_30 = in_XMM0_Qa * *local_30;
        local_30 = local_30 + 1;
      }
    }
    (in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return in_RDI;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator*=(const TVar value )
{
	if ( IsZero( value ) )
    {
		Zero();
		return( *this );
    }
	
	int64_t col, colmax = this->Dim();
	for (col=0; col<colmax; col++ )
    {
		// Efetua a MULTIPLICACAO.
		TVar *elem = fElem[col];
		TVar *end  = fElem[col+1];
		while ( elem < end ) *elem++ *= value;
    }
	
	this->fDecomposed = 0;
	return( *this );
}